

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O2

void __thiscall xmrig::FailoverStrategy::~FailoverStrategy(FailoverStrategy *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  (this->super_IStrategy)._vptr_IStrategy = (_func_int **)&PTR__FailoverStrategy_001bb370;
  (this->super_IClientListener)._vptr_IClientListener =
       (_func_int **)&PTR__FailoverStrategy_001bb3f0;
  ppIVar1 = (this->m_pools).super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->m_pools).
                 super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar2 != ppIVar1; ppIVar2 = ppIVar2 + 1) {
    (*(*ppIVar2)->_vptr_IClient[0x13])();
  }
  std::_Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::~_Vector_base
            (&(this->m_pools).
              super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>);
  return;
}

Assistant:

xmrig::FailoverStrategy::~FailoverStrategy()
{
    for (IClient *client : m_pools) {
        client->deleteLater();
    }
}